

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O2

TimingControl *
slang::ast::SignalEventControl::fromExpr
          (Compilation *compilation,EdgeKind edge,Expression *expr,Expression *iffCondition,
          ASTContext *context,SourceRange sourceRange)

{
  not_null<const_slang::ast::Type_*> *this;
  EdgeKind EVar1;
  bool bVar2;
  bool bVar3;
  SignalEventControl *ctrl;
  Symbol *pSVar4;
  Type *pTVar5;
  Diagnostic *diag;
  TimingControl *pTVar6;
  SourceLocation SVar7;
  DiagCode code;
  SourceRange sourceRange_00;
  EdgeKind edge_local;
  Expression *iffCondition_local;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  SourceLocation SVar8;
  
  edge_local = edge;
  iffCondition_local = iffCondition;
  ctrl = BumpAllocator::
         emplace<slang::ast::SignalEventControl,slang::ast::EdgeKind&,slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::SourceRange&>
                   (&compilation->super_BumpAllocator,&edge_local,expr,&iffCondition_local,
                    &sourceRange);
  bVar2 = Expression::bad(expr);
  if (bVar2) goto LAB_0023dac1;
  pSVar4 = Expression::getSymbolReference(expr,true);
  EVar1 = edge_local;
  if ((pSVar4 == (Symbol *)0x0) || (bVar2 = true, pSVar4->kind != ClockingBlock)) {
    bVar2 = expr->kind == ClockingEvent;
  }
  this = &expr->type;
  pTVar5 = not_null<const_slang::ast::Type_*>::get(this);
  if (EVar1 == None) {
    bVar3 = Type::isAggregate(pTVar5);
    if (!bVar3) {
      pTVar5 = not_null<const_slang::ast::Type_*>::get(this);
      bVar3 = Type::isCHandle(pTVar5);
      if (!bVar3) {
        pTVar5 = not_null<const_slang::ast::Type_*>::get(this);
        bVar3 = Type::isPropertyType(pTVar5);
        if (!bVar3) {
          pTVar5 = not_null<const_slang::ast::Type_*>::get(this);
          bVar3 = Type::isVoid(pTVar5);
          if ((~bVar3 & 1U) != 0 || bVar2) goto LAB_0023d9bd;
        }
      }
    }
    SVar8 = (expr->sourceRange).startLoc;
    SVar7 = (expr->sourceRange).endLoc;
    code.subsystem = Statements;
    code.code = 0x1e;
  }
  else {
    bVar3 = Type::isIntegral(pTVar5);
    if (bVar3) {
LAB_0023d9bd:
      if ((iffCondition_local == (Expression *)0x0) ||
         (bVar2 = ASTContext::requireBooleanConvertible(context,iffCondition_local), bVar2)) {
        ASTContext::tryEval((ConstantValue *)&local_58,context,expr);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage(&local_58);
        if (local_58._M_index == '\0') {
          return &ctrl->super_TimingControl;
        }
        ASTContext::addDiag(context,(DiagCode)0x4f0008,expr->sourceRange);
        return &ctrl->super_TimingControl;
      }
      goto LAB_0023dac1;
    }
    SVar8 = (expr->sourceRange).startLoc;
    SVar7 = (expr->sourceRange).endLoc;
    if (bVar2) {
      ASTContext::addDiag(context,(DiagCode)0xa0008,expr->sourceRange);
      goto LAB_0023dac1;
    }
    code.subsystem = Expressions;
    code.code = 0x4b;
  }
  sourceRange_00.endLoc = SVar7;
  sourceRange_00.startLoc = SVar8;
  diag = ASTContext::addDiag(context,code,sourceRange_00);
  pTVar5 = not_null<const_slang::ast::Type_*>::get(this);
  ast::operator<<(diag,pTVar5);
LAB_0023dac1:
  pTVar6 = TimingControl::badCtrl(compilation,&ctrl->super_TimingControl);
  return pTVar6;
}

Assistant:

TimingControl& SignalEventControl::fromExpr(Compilation& compilation, EdgeKind edge,
                                            const Expression& expr, const Expression* iffCondition,
                                            const ASTContext& context, SourceRange sourceRange) {
    auto result = compilation.emplace<SignalEventControl>(edge, expr, iffCondition, sourceRange);
    if (expr.bad())
        return badCtrl(compilation, result);

    // Note: `expr` here can be a void-typed HierarchicalReferenceExpression if it's
    // referring to a clocking block.
    auto symRef = expr.getSymbolReference();
    bool isClocking = (symRef && symRef->kind == SymbolKind::ClockingBlock) ||
                      expr.kind == ExpressionKind::ClockingEvent;

    if (edge == EdgeKind::None) {
        if (expr.type->isAggregate() || expr.type->isCHandle() || expr.type->isPropertyType() ||
            (expr.type->isVoid() && !isClocking)) {
            context.addDiag(diag::InvalidEventExpression, expr.sourceRange) << *expr.type;
            return badCtrl(compilation, result);
        }
    }
    else if (!expr.type->isIntegral()) {
        if (isClocking)
            context.addDiag(diag::ClockingBlockEventEdge, expr.sourceRange);
        else
            context.addDiag(diag::ExprMustBeIntegral, expr.sourceRange) << *expr.type;
        return badCtrl(compilation, result);
    }

    if (iffCondition) {
        if (!context.requireBooleanConvertible(*iffCondition))
            return badCtrl(compilation, result);
    }

    // Warn if the expression is constant, since it'll never change to trigger off.
    if (context.tryEval(expr))
        context.addDiag(diag::EventExpressionConstant, expr.sourceRange);

    return *result;
}